

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

Patient * __thiscall
Hospital::Entered_Patient
          (Hospital *this,string *username,string *password,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients)

{
  __type _Var1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  __type local_a1;
  undefined1 local_70 [64];
  int local_30;
  int local_2c;
  int i;
  int g;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  string *password_local;
  string *username_local;
  Hospital *this_local;
  
  local_2c = 0;
  local_30 = 0;
  _i = All_Of_Patients;
  All_Of_Patients_local = (vector<Patient,_std::allocator<Patient>_> *)password;
  password_local = username;
  username_local = &this->Admin_Username;
  do {
    uVar2 = (ulong)local_30;
    sVar3 = std::vector<Patient,_std::allocator<Patient>_>::size(All_Of_Patients);
    if (sVar3 <= uVar2) {
LAB_001232c6:
      pvVar4 = std::vector<Patient,_std::allocator<Patient>_>::operator[]
                         (All_Of_Patients,(long)local_2c);
      return pvVar4;
    }
    std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)local_30);
    Human::User_name_Getter_abi_cxx11_((Human *)(local_70 + 0x20));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_70 + 0x20),username);
    local_a1 = false;
    if (_Var1) {
      std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)local_30);
      Human::Password_Getter_abi_cxx11_((Human *)local_70);
      local_a1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_70,password);
      std::__cxx11::string::~string((string *)local_70);
    }
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    if (local_a1 != false) {
      local_2c = local_30;
      goto LAB_001232c6;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

Patient* Hospital :: Entered_Patient(string username , string password , vector<Patient>All_Of_Patients){
    int g =0;
    for (int i = 0; i < All_Of_Patients.size(); ++i) {
        if (All_Of_Patients[i].User_name_Getter() == username && All_Of_Patients[i].Password_Getter() == password) {
            g = i;
            break;
        }
    }

    return &All_Of_Patients[g];
}